

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/util.cpp:17:30)>
::do_call(Proxy_Function_Callable_Impl<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_util_cpp:17:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  int t;
  Boxed_Value *in_RCX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  Boxed_Value BVar2;
  Result_Type local_38;
  
  boxed_cast<std::__cxx11::string>
            (&local_38,(chaiscript *)(t_conversions->m_conversions)._M_data,in_RCX,
             (Type_Conversions_State *)in_RCX);
  t = chdir(local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  sVar1 = Boxed_Value::Object_Data::get<int>((Object_Data *)this,t,true);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }